

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcoli.c
# Opt level: O2

int ffi2fstr(short *input,long ntodo,double scale,double zero,char *cform,long twidth,char *output,
            int *status)

{
  long lVar1;
  char *pcVar2;
  long lVar3;
  
  lVar1 = 0;
  if (0 < ntodo) {
    lVar1 = ntodo;
  }
  if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
    pcVar2 = output;
    for (lVar3 = 0; lVar1 != lVar3; lVar3 = lVar3 + 1) {
      snprintf(pcVar2,0x7080,cform,((double)(int)input[lVar3] - zero) / scale);
      if (pcVar2[twidth] != '\0') {
        *status = -0xb;
      }
      pcVar2 = pcVar2 + twidth;
    }
  }
  else {
    pcVar2 = output;
    for (lVar3 = 0; lVar1 != lVar3; lVar3 = lVar3 + 1) {
      snprintf(pcVar2,0x7080,cform,(double)(int)input[lVar3]);
      if (pcVar2[twidth] != '\0') {
        *status = -0xb;
      }
      pcVar2 = pcVar2 + twidth;
    }
  }
  while( true ) {
    output = strchr(output,0x2c);
    if (output == (char *)0x0) break;
    *output = '.';
  }
  return *status;
}

Assistant:

int ffi2fstr(short *input,     /* I - array of values to be converted  */
            long ntodo,        /* I - number of elements in the array  */
            double scale,      /* I - FITS TSCALn or BSCALE value      */
            double zero,       /* I - FITS TZEROn or BZERO  value      */
            char *cform,       /* I - format for output string values  */
            long twidth,       /* I - width of each field, in chars    */
            char *output,      /* O - output array of converted values */
            int *status)       /* IO - error status                    */
/*
  Copy input to output prior to writing output to a FITS file.
  Do scaling if required.
*/
{
    long ii;
    double dvalue;
    char *cptr;
    
    cptr = output;

    if (scale == 1. && zero == 0.)
    {       
        for (ii = 0; ii < ntodo; ii++)
        {
           snprintf(output, DBUFFSIZE, cform, (double) input[ii]);
           output += twidth;

           if (*output)  /* if this char != \0, then overflow occurred */
              *status = OVERFLOW_ERR;
        }
    }
    else
    {
        for (ii = 0; ii < ntodo; ii++)
        {
          dvalue = (input[ii] - zero) / scale;
          snprintf(output, DBUFFSIZE, cform, dvalue);
          output += twidth;

          if (*output)  /* if this char != \0, then overflow occurred */
            *status = OVERFLOW_ERR;
        }
    }

    /* replace any commas with periods (e.g., in French locale) */
    while ((cptr = strchr(cptr, ','))) *cptr = '.';

    return(*status);
}